

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenidmem.cpp
# Opt level: O2

int main(int argsc,char **argsv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  Token *pTVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  LanguageConfiguration cfg;
  Logger log;
  BaseLogger local_288;
  Lexer lex;
  istringstream input;
  
  iVar1 = 1;
  if ((argsc == 2) && (__s = argsv[1], *__s != '\0')) {
    sVar2 = strlen(__s);
    lex._vptr_Lexer = (_func_int **)&lex.input;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lex,__s,__s + sVar2 + 1);
    std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&lex,_S_in);
    std::__cxx11::string::~string((string *)&lex);
    cfg.multiLineString = false;
    cfg.multiLineStringLeftTrim = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log,"<args[1]>",(allocator<char> *)&local_288);
    pfederc::Lexer::Lexer(&lex,&cfg,(istream *)&input,(string *)&log);
    std::__cxx11::string::~string((string *)&log);
    pTVar3 = pfederc::Lexer::next(&lex);
    log._vptr_Logger._0_2_ = pTVar3->type;
    pmVar4 = std::__detail::
             _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)pfederc::TOKEN_TYPE_STRINGS_abi_cxx11_,(key_type *)&log);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    pfederc::BaseLogger::BaseLogger(&local_288,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              (&log,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,&local_288);
    pfederc::BaseLogger::~BaseLogger(&local_288);
    pfederc::logLexerErrors(&log,&lex);
    pfederc::Logger::~Logger(&log);
    pfederc::Lexer::~Lexer(&lex);
    std::__cxx11::istringstream::~istringstream((istringstream *)&input);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argsc, char * argsv[]) {
  if (argsc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(std::string(argsv[1], strlen(argsv[1]) + 1));
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");
  const Token &tok = lex.next();
  std::cout << TOKEN_TYPE_STRINGS.at(tok.getType()) << std::endl;
  Logger log;
  logLexerErrors(log, lex);
  return 0;
}